

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

void Curl_free_primary_ssl_config(ssl_primary_config *sslc)

{
  (*Curl_cfree)(sslc->CApath);
  sslc->CApath = (char *)0x0;
  (*Curl_cfree)(sslc->CAfile);
  sslc->CAfile = (char *)0x0;
  (*Curl_cfree)(sslc->issuercert);
  sslc->issuercert = (char *)0x0;
  (*Curl_cfree)(sslc->clientcert);
  sslc->clientcert = (char *)0x0;
  (*Curl_cfree)(sslc->cipher_list);
  sslc->cipher_list = (char *)0x0;
  (*Curl_cfree)(sslc->cipher_list13);
  sslc->cipher_list13 = (char *)0x0;
  (*Curl_cfree)(sslc->pinned_key);
  sslc->pinned_key = (char *)0x0;
  (*Curl_cfree)(sslc->cert_blob);
  sslc->cert_blob = (curl_blob *)0x0;
  (*Curl_cfree)(sslc->ca_info_blob);
  sslc->ca_info_blob = (curl_blob *)0x0;
  (*Curl_cfree)(sslc->issuercert_blob);
  sslc->issuercert_blob = (curl_blob *)0x0;
  (*Curl_cfree)(sslc->curves);
  sslc->curves = (char *)0x0;
  (*Curl_cfree)(sslc->CRLfile);
  sslc->CRLfile = (char *)0x0;
  return;
}

Assistant:

static void Curl_free_primary_ssl_config(struct ssl_primary_config *sslc)
{
  Curl_safefree(sslc->CApath);
  Curl_safefree(sslc->CAfile);
  Curl_safefree(sslc->issuercert);
  Curl_safefree(sslc->clientcert);
  Curl_safefree(sslc->cipher_list);
  Curl_safefree(sslc->cipher_list13);
  Curl_safefree(sslc->pinned_key);
  Curl_safefree(sslc->cert_blob);
  Curl_safefree(sslc->ca_info_blob);
  Curl_safefree(sslc->issuercert_blob);
  Curl_safefree(sslc->curves);
  Curl_safefree(sslc->CRLfile);
#ifdef USE_TLS_SRP
  Curl_safefree(sslc->username);
  Curl_safefree(sslc->password);
#endif
}